

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_invalidMathmlCellMLNsOnNode_Test::TestBody
          (Validator_invalidMathmlCellMLNsOnNode_Test *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_881;
  allocator_type local_14b;
  allocator<char> local_14a;
  allocator<char> local_149;
  ModelPtr m;
  ComponentPtr c;
  allocator<char> local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  string math;
  ValidatorPtr v;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&math,
             "<math  xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply><cellml:bvar><ci cellml:units=\"dimensionless\">B</ci></cellml:bvar></apply></math>"
             ,(allocator<char> *)&v);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v,
             "Model \'\' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters."
             ,(allocator<char> *)&m);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,
             "Component \'\' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters."
             ,(allocator<char> *)&c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Math has a \'bvar\' element that is not a supported MathML element.",
             local_128);
  std::__cxx11::string::string<std::allocator<char>>
            (local_80,
             "MathML ci element has the child text \'B\' which does not correspond with any variable names present in component \'\'."
             ,(allocator<char> *)&gtest_trace_881);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"W3C MathML DTD error: No declaration for attribute units of element ci.",
             &local_149);
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"Math has a \'bvar\' element without exactly two MathML siblings.",&local_14a)
  ;
  __l._M_len = 6;
  __l._M_array = (iterator)&v;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&expectedIssues,__l,&local_14b);
  lVar1 = 0xa0;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  libcellml::Validator::create();
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::setMath
            ((string *)c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  libcellml::Validator::validateModel
            ((shared_ptr *)
             v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  testing::ScopedTrace::ScopedTrace
            (&gtest_trace_881,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/validator/validator.cpp"
             ,0x371,"Issue occurred here.");
  std::__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Validator,void>
            ((__shared_ptr<libcellml::Logger,(__gnu_cxx::_Lock_policy)2> *)local_128,
             &v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>);
  expectEqualIssues((vector *)&expectedIssues,(shared_ptr *)local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_881);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedIssues);
  std::__cxx11::string::~string((string *)&math);
  return;
}

Assistant:

TEST(Validator, invalidMathmlCellMLNsOnNode)
{
    const std::string math =
        "<math  xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" xmlns=\"http://www.w3.org/1998/Math/MathML\"><apply><cellml:bvar><ci cellml:units=\"dimensionless\">B</ci></cellml:bvar></apply></math>";
    const std::vector<std::string> expectedIssues = {
        "Model '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Component '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
        "Math has a 'bvar' element that is not a supported MathML element.",
        "MathML ci element has the child text 'B' which does not correspond with any variable names present in component ''.",
        "W3C MathML DTD error: No declaration for attribute units of element ci.",
        "Math has a 'bvar' element without exactly two MathML siblings.",
    };
    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();

    c->setMath(math);
    m->addComponent(c);

    v->validateModel(m);
    EXPECT_EQ_ISSUES(expectedIssues, v);
}